

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-wear.c
# Opt level: O0

_Bool borg_test_stuff(void)

{
  bool bVar1;
  _Bool _Var2;
  _Bool _Var3;
  wchar_t wVar4;
  borg_item_conflict *pbVar5;
  char *what;
  borg_item_conflict *item_2;
  borg_item_conflict *item_1;
  int v_1;
  borg_item_conflict *item;
  int v;
  _Bool free_id;
  int iStack_14;
  _Bool inv_item_needs_id;
  int b_v;
  int b_i;
  int i;
  
  iStack_14 = -1;
  v = -1;
  bVar1 = false;
  _Var2 = borg_spell_legal(IDENTIFY_RUNE);
  if ((((0x31 < borg.trait[0x1e]) || (_Var3 = borg_spell_legal(IDENTIFY_RUNE), !_Var3)) ||
      (_Var3 = borg_check_rest(borg.c.y,borg.c.x), _Var3)) &&
     (wVar4 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false), wVar4 < L'\x02')) {
    for (b_v = (int)z_info->pack_size;
        b_v < (int)(z_info->pack_size + 0xc + (uint)z_info->quiver_size); b_v = b_v + 1) {
      item._0_4_ = 0;
      pbVar5 = borg_items + b_v;
      if ((pbVar5->iqty != '\0') && ((pbVar5->needs_ident & 1U) != 0)) {
        if (pbVar5->art_idx != '\0') {
          item._0_4_ = pbVar5->value + 150000;
        }
        _Var3 = borg_ego_has_random_power(e_info + pbVar5->ego_idx);
        if (_Var3) {
          item._0_4_ = pbVar5->value + 100000;
        }
        _Var3 = borg_item_note_needs_id(pbVar5);
        if (_Var3) {
          item._0_4_ = pbVar5->value + 20000;
        }
        if (((int)item != 0) && (v < (int)item)) {
          iStack_14 = b_v;
          v = (int)item;
        }
      }
    }
    for (b_v = 0; b_v < (int)(z_info->pack_size + 0xc + (uint)z_info->quiver_size); b_v = b_v + 1) {
      item_1._4_4_ = 0;
      pbVar5 = borg_items + b_v;
      if ((pbVar5->iqty != '\0') && ((pbVar5->needs_ident & 1U) != 0)) {
        if (b_v < (int)(uint)z_info->pack_size) {
          bVar1 = true;
        }
        if (pbVar5->art_idx != '\0') {
          item_1._4_4_ = pbVar5->value + 150000;
        }
        _Var3 = borg_item_note_needs_id(pbVar5);
        if (_Var3) {
          item_1._4_4_ = pbVar5->value + 20000;
        }
        else if ((_Var2) || (_Var3 = borg_item_worth_id(pbVar5), _Var3)) {
          item_1._4_4_ = pbVar5->value;
        }
        if ((pbVar5->aware & 1U) == 0) {
          switch(pbVar5->tval) {
          case '\x14':
          case '\x15':
            item_1._4_4_ = item_1._4_4_ + borg.trait[0x6a] * 5000;
            break;
          case '\x16':
          case '\x17':
            item_1._4_4_ = item_1._4_4_ + borg.trait[0x6a] * 2000;
            break;
          case '\x18':
            item_1._4_4_ = item_1._4_4_ + borg.trait[0x6a] * 3000;
            break;
          case '\x19':
          case '\x1a':
            if (4 < borg.trait[0x6a]) {
              item_1._4_4_ = item_1._4_4_ + borg.trait[0x6a] * 500;
            }
            break;
          case '\x1c':
            item_1._4_4_ = item_1._4_4_ + borg.trait[0x6a] * 10;
          }
        }
        if ((item_1._4_4_ != 0) && (v < item_1._4_4_)) {
          iStack_14 = b_v;
          v = item_1._4_4_;
        }
      }
    }
    if (-1 < iStack_14) {
      pbVar5 = borg_items + iStack_14;
      _Var2 = borg_spell(IDENTIFY_RUNE);
      if ((_Var2) || (_Var2 = borg_read_scroll(sv_scroll_identify), _Var2)) {
        what = format("# Identifying %s.",pbVar5);
        borg_note(what);
        if ((iStack_14 < (int)(uint)z_info->pack_size) ||
           ((int)(z_info->pack_size + 0xc) <= iStack_14)) {
          if (iStack_14 < (int)(z_info->pack_size + 0xc)) {
            borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[iStack_14]);
          }
          else {
            borg_keypress(0x7c);
            borg_keypress((iStack_14 - (z_info->pack_size + 0xc)) + 0x30);
          }
        }
        else {
          if (bVar1) {
            borg_keypress(0x2f);
          }
          borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"
                             [(int)(iStack_14 - (uint)z_info->pack_size)]);
        }
        borg_keypress(0xe000);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool borg_test_stuff(void)
{
    int  i;
    int  b_i = -1, b_v = -1;
    bool inv_item_needs_id = false;
    bool free_id           = borg_spell_legal(IDENTIFY_RUNE);

    /* don't ID stuff when you can't recover spent spell point immediately */
    if (borg.trait[BI_CURSP] < 50 && borg_spell_legal(IDENTIFY_RUNE)
        && !borg_check_rest(borg.c.y, borg.c.x))
        return false;

    /* No ID if in danger */
    if (borg_danger(borg.c.y, borg.c.x, 1, true, false) > 1)
        return false;

    /* Look for an item to identify (equipment) */
    for (i = INVEN_WIELD; i < QUIVER_END; i++) {
        int        v    = 0;
        borg_item *item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;
        if (!item->needs_ident)
            continue;

        /* Preferentially ID egos and artifacts */
        if (item->art_idx)
            v = item->value + 150000L;

        if (borg_ego_has_random_power(&e_info[item->ego_idx])) {
            v = item->value + 100000L;
        }

        /* Prioritize the ID */
        if (borg_item_note_needs_id(item))
            v = item->value + 20000L;

        /* Ignore */
        if (!v)
            continue;

        /* Track the best */
        if (v <= b_v)
            continue;

        /* Track it */
        b_i = i;
        b_v = v;
    }

    /* Look for an item to identify  */
    for (i = 0; i < QUIVER_END; i++) {
        int        v    = 0;
        borg_item *item = &borg_items[i];

        /* Skip empty and ID'd items */
        if (!item->iqty)
            continue;
        if (!item->needs_ident)
            continue;

        if (i < z_info->pack_size)
            inv_item_needs_id = true;

        /* Preferentially ID artifacts */
        if (item->art_idx)
            v = item->value + 150000L;

        /* Identify "good" items */
        if (borg_item_note_needs_id(item))
            v = item->value + 20000L;
        else if (free_id || borg_item_worth_id(item))
            v = item->value;

        /* Hack -- reward "unaware" items */
        if (!item->aware) {
            /* Analyze the type */
            switch (item->tval) {
            case TV_RING:
            case TV_AMULET:
                v += (borg.trait[BI_MAXDEPTH] * 5000L);
                break;

            case TV_ROD:
                v += (borg.trait[BI_MAXDEPTH] * 3000L);
                break;

            case TV_WAND:
            case TV_STAFF:
                v += (borg.trait[BI_MAXDEPTH] * 2000L);
                break;

            case TV_POTION:
            case TV_SCROLL:
                /* Hack -- boring levels */
                if (borg.trait[BI_MAXDEPTH] < 5)
                    break;

                /* Hack -- reward depth */
                v += (borg.trait[BI_MAXDEPTH] * 500L);
                break;

            case TV_FOOD:
                v += (borg.trait[BI_MAXDEPTH] * 10L);
                break;
            }
        }

        /* Ignore */
        if (!v)
            continue;

        /* Track the best */
        if (v <= b_v)
            continue;

        /* Track it */
        b_i = i;
        b_v = v;
    }

    /* Found something */
    if (b_i >= 0) {
        borg_item *item = &borg_items[b_i];

        /* Use an item to identify */
        if (borg_spell(IDENTIFY_RUNE) || borg_read_scroll(sv_scroll_identify)) {
            /* Log -- may be cancelled */
            borg_note(format("# Identifying %s.", item->desc));

            /* Equipment */
            if (b_i >= INVEN_WIELD && b_i < QUIVER_START) {
                if (inv_item_needs_id)
                    borg_keypress('/');

                /* Select the item */
                borg_keypress(all_letters_nohjkl[b_i - INVEN_WIELD]);

            } else if (b_i >= QUIVER_START) {
                /* Select quiver */
                borg_keypress('|');

                /* Select the item */
                borg_keypress(I2D(b_i - QUIVER_START));
            }
            /* Inventory */
            else {
                /* Select the item */
                borg_keypress(all_letters_nohjkl[b_i]);
            }

            borg_keypress(ESCAPE);

            return true;
        }
    }

    /* Nothing to do */
    return false;
}